

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  ExtractModel *this_00;
  pointer pcVar1;
  undefined1 local_78 [48];
  _Alloc_hider local_48;
  char local_38 [16];
  
  this_00 = this->actor;
  pcVar1 = (nvp->name)._M_dataplus._M_p;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + (nvp->name)._M_string_length);
  local_78._32_4_ = *(undefined4 *)&(nvp->stream).ct;
  local_78._36_4_ = *(undefined4 *)((long)&(nvp->stream).ct + 4);
  local_78._40_4_ = *(undefined4 *)&(nvp->stream).it._M_current;
  local_78._44_4_ = *(undefined4 *)((long)&(nvp->stream).it._M_current + 4);
  pcVar1 = (nvp->stream).xx._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (nvp->stream).xx._M_string_length);
  ExtractModel::
  act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (this_00,this,
             (collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_78);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}